

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall defyx::JitCompilerX86::JitCompilerX86(JitCompilerX86 *this)

{
  void *pvVar1;
  long in_RDI;
  size_t in_stack_ffffffffffffffe0;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x150cf0);
  pvVar1 = allocExecutableMemory(in_stack_ffffffffffffffe0);
  *(void **)(in_RDI + 0x38) = pvVar1;
  memcpy(*(void **)(in_RDI + 0x38),codePrologue,(long)prologueSize);
  memcpy((void *)(*(long *)(in_RDI + 0x38) + (long)epilogueOffset),codeEpilogue,(long)epilogueSize);
  return;
}

Assistant:

JitCompilerX86::JitCompilerX86() {
		code = (uint8_t*)allocExecutableMemory(CodeSize);
		memcpy(code, codePrologue, prologueSize);
		memcpy(code + epilogueOffset, codeEpilogue, epilogueSize);
	}